

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

Aig_ManPack_t * Aig_ManPackAlloc(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_ManPack_t *pAVar2;
  Vec_Wrd_t *pVVar3;
  Aig_ManPack_t *p;
  Aig_Man_t *pAig_local;
  
  pAVar2 = (Aig_ManPack_t *)calloc(1,0x38);
  pAVar2->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  pVVar3 = Vec_WrdStart(iVar1);
  pAVar2->vSigns = pVVar3;
  iVar1 = Aig_ManCiNum(pAig);
  pVVar3 = Vec_WrdStart(iVar1);
  pAVar2->vPiPats = pVVar3;
  iVar1 = Aig_ManCiNum(pAig);
  pVVar3 = Vec_WrdStart(iVar1);
  pAVar2->vPiCare = pVVar3;
  pAVar2->iPatCur = 1;
  return pAVar2;
}

Assistant:

Aig_ManPack_t * Aig_ManPackAlloc( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = ABC_CALLOC( Aig_ManPack_t, 1 );
    p->pAig    = pAig;
    p->vSigns  = Vec_WrdStart( Aig_ManObjNumMax(pAig) );
    p->vPiPats = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->vPiCare = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->iPatCur = 1;
    return p;
}